

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O1

double inv_boxcox_eval(double *x,int N,double lambda,double *bxcx)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = lambda;
  if ((lambda != 0.0) || (NAN(lambda))) {
    if (0 < N) {
      uVar1 = 0;
      do {
        dVar2 = log1p(x[uVar1] * lambda);
        dVar2 = exp(dVar2 / lambda);
        bxcx[uVar1] = dVar2;
        uVar1 = uVar1 + 1;
      } while ((uint)N != uVar1);
    }
  }
  else if (0 < N) {
    uVar1 = 0;
    do {
      dVar2 = exp(x[uVar1]);
      bxcx[uVar1] = dVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return dVar2;
}

Assistant:

double inv_boxcox_eval(double *x,int N, double lambda,double *bxcx) {
    int i;

    if (lambda == 0) {
        for(i = 0; i < N;++i) {
            bxcx[i] = exp(x[i]);
        }
    } else {
        for(i = 0; i < N;++i) {
            bxcx[i] = exp(log1p(lambda * x[i])/lambda);
        }
    }
}